

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b0ec::Decode_InputTooShort_Test::~Decode_InputTooShort_Test
          (Decode_InputTooShort_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Decode, InputTooShort) {
	auto [_, optErr] = multihash::decode("");
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errTooShort << "'";
	ASSERT_EQ(multihash::errTooShort, optErr.value());

	std::tie(_, optErr) = multihash::decode("c");
	ASSERT_TRUE(optErr) << "Expected an error. expected: '" << multihash::errTooShort << "'";
	ASSERT_EQ(multihash::errTooShort, optErr.value());
}